

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr.cc
# Opt level: O2

bool kratos::safe_to_resize_
               (Simulator *sim,Var *var,uint32_t target_size,bool is_signed,
               queue<const_kratos::IterVar_*,_std::deque<const_kratos::IterVar_*,_std::allocator<const_kratos::IterVar_*>_>_>
               *vars)

{
  _Elt_pointer ppIVar1;
  IterVar *var_00;
  undefined4 target_size_00;
  undefined1 is_signed_00;
  bool bVar2;
  ConstantLegal CVar3;
  int iVar4;
  uint uVar5;
  undefined4 extraout_var;
  undefined7 in_register_00000009;
  optional<long> value;
  optional<long> value_00;
  IterVar *local_60;
  IterVar *t;
  optional<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_> v;
  
  ppIVar1 = (vars->c).
            super__Deque_base<const_kratos::IterVar_*,_std::allocator<const_kratos::IterVar_*>_>.
            _M_impl.super__Deque_impl_data._M_start._M_cur;
  if ((vars->c).super__Deque_base<const_kratos::IterVar_*,_std::allocator<const_kratos::IterVar_*>_>
      ._M_impl.super__Deque_impl_data._M_finish._M_cur == ppIVar1) {
    iVar4 = (*(var->super_IRNode)._vptr_IRNode[0x28])(var);
    if ((*(uint *)(CONCAT44(extraout_var,iVar4) + 0x168) & 0xfffffffb) != 0) {
      return true;
    }
    uVar5 = (*(var->super_IRNode)._vptr_IRNode[7])(var);
    return uVar5 <= target_size;
  }
  v.super__Optional_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_false,_false>.
  _M_payload.
  super__Optional_payload<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_true,_false,_false>
  .super__Optional_payload_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>._28_4_
       = SUB84(CONCAT71(in_register_00000009,is_signed),0);
  var_00 = *ppIVar1;
  local_60 = var_00;
  v.super__Optional_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_false,_false>.
  _M_payload.
  super__Optional_payload<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_true,_false,_false>
  .super__Optional_payload_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>._24_4_
       = target_size;
  std::deque<const_kratos::IterVar_*,_std::allocator<const_kratos::IterVar_*>_>::pop_front(&vars->c)
  ;
  value.super__Optional_base<long,_true,_true>._M_payload.super__Optional_payload_base<long>._8_8_ =
       1;
  value.super__Optional_base<long,_true,_true>._M_payload.super__Optional_payload_base<long>.
  _M_payload = (_Storage<long,_true>)(_Storage<long,_true>)var_00->min_value_;
  Simulator::set_i(sim,&var_00->super_Var,value,false);
  Simulator::eval_expr
            ((optional<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_> *)&t,sim,var);
  if (v.
      super__Optional_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_false,_false>
      ._M_payload.
      super__Optional_payload<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_true,_false,_false>
      .super__Optional_payload_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>.
      _M_payload.field2[0x10] == '\x01') {
    is_signed_00 = v.
                   super__Optional_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_false,_false>
                   ._M_payload.
                   super__Optional_payload<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_true,_false,_false>
                   .
                   super__Optional_payload_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                   ._28_1_;
    v.super__Optional_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_false,_false>
    ._M_payload.
    super__Optional_payload<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_true,_false,_false>
    .super__Optional_payload_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>.
    _28_4_ = v.
             super__Optional_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_false,_false>
             ._M_payload.
             super__Optional_payload<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_true,_false,_false>
             .
             super__Optional_payload_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
             ._28_4_ & 0xff;
    CVar3 = Const::is_legal((int64_t)(t->super_Var).super_IRNode._vptr_IRNode,
                            v.
                            super__Optional_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_false,_false>
                            ._M_payload.
                            super__Optional_payload<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_true,_false,_false>
                            .
                            super__Optional_payload_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                            ._24_4_,(bool)is_signed_00);
    std::_Optional_payload_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>::
    _M_reset((_Optional_payload_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_> *)
             &t);
    if (CVar3 != Legal) {
      return false;
    }
    value_00.super__Optional_base<long,_true,_true>._M_payload.super__Optional_payload_base<long>.
    _M_payload._M_value = var_00->max_value_ + -1;
    value_00.super__Optional_base<long,_true,_true>._M_payload.super__Optional_payload_base<long>.
    _8_8_ = 1;
    Simulator::set_i(sim,&var_00->super_Var,value_00,false);
    Simulator::eval_expr
              ((optional<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_> *)&t,sim,var);
    target_size_00 =
         v.
         super__Optional_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_false,_false>
         ._M_payload.
         super__Optional_payload<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_true,_false,_false>
         .super__Optional_payload_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>.
         _24_4_;
    if (v.
        super__Optional_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_false,_false>
        ._M_payload.
        super__Optional_payload<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_true,_false,_false>
        .super__Optional_payload_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>.
        _M_payload.field2[0x10] == '\x01') {
      CVar3 = Const::is_legal((int64_t)(t->super_Var).super_IRNode._vptr_IRNode,
                              v.
                              super__Optional_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_false,_false>
                              ._M_payload.
                              super__Optional_payload<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_true,_false,_false>
                              .
                              super__Optional_payload_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                              ._24_4_,v.
                                      super__Optional_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_false,_false>
                                      ._M_payload.
                                      super__Optional_payload<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_true,_false,_false>
                                      .
                                      super__Optional_payload_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                                      ._28_1_);
      std::_Optional_payload_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>::
      _M_reset((_Optional_payload_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                *)&t);
      if (CVar3 != Legal) {
        return false;
      }
      bVar2 = safe_to_resize_(sim,var,target_size_00,
                              v.
                              super__Optional_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_false,_false>
                              ._M_payload.
                              super__Optional_payload<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_true,_false,_false>
                              .
                              super__Optional_payload_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                              ._28_1_,vars);
      std::deque<const_kratos::IterVar_*,_std::allocator<const_kratos::IterVar_*>_>::push_back
                (&vars->c,&local_60);
      return bVar2;
    }
  }
  std::_Optional_payload_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>::_M_reset
            ((_Optional_payload_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_> *)
             &t);
  return false;
}

Assistant:

bool safe_to_resize_(Simulator &sim, const Var *var, uint32_t target_size, bool is_signed,
                     std::queue<const IterVar *> &vars) {
    // notice it's exclusive for max
    if (vars.empty()) {
        const auto *p = var->get_var_root_parent();
        if (p->type() == VarType::Base || p->type() == VarType::PortIO)
            return var->width() <= target_size;
        else
            return true;
    } else {
        // pop one
        auto *t = const_cast<IterVar *>(vars.front());
        vars.pop();
        sim.set_i(t, t->min_value(), false);
        {
            auto v = sim.eval_expr(var);
            auto num = convert_value(var, v);
            if (!num) return false;
            auto result =
                Const::is_legal(*num, target_size, is_signed) == Const::ConstantLegal::Legal;
            if (!result) return false;
        }
        // notice it's exclusive for max
        sim.set_i(t, t->max_value() - 1, false);
        {
            auto v = sim.eval_expr(var);
            auto num = convert_value(var, v);
            if (!num) return false;
            auto result =
                Const::is_legal(*num, target_size, is_signed) == Const::ConstantLegal::Legal;
            if (!result) return false;
        }
        auto r = safe_to_resize_(sim, var, target_size, is_signed, vars);
        // put it back for backtracking
        vars.push(t);
        return r;
    }
}